

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O0

void __thiscall
entt::basic_storage<entt::entity,_Swarm,_void>::swap
          (basic_storage<entt::entity,_Swarm,_void> *this,size_type lhs,size_type rhs)

{
  size_type sVar1;
  reference __a;
  reference __b;
  size_type rhs_local;
  size_type lhs_local;
  basic_storage<entt::entity,_Swarm,_void> *this_local;
  
  sVar1 = std::vector<Swarm,_std::allocator<Swarm>_>::size(&this->instances);
  if (sVar1 <= lhs) {
    __assert_fail("lhs < instances.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/entt/single_include/entt/entt.hpp"
                  ,0x144e,
                  "virtual void entt::basic_storage<entt::entity, Swarm>::swap(const size_type, const size_type) [Entity = entt::entity, Type = Swarm]"
                 );
  }
  sVar1 = std::vector<Swarm,_std::allocator<Swarm>_>::size(&this->instances);
  if (rhs < sVar1) {
    __a = std::vector<Swarm,_std::allocator<Swarm>_>::operator[](&this->instances,lhs);
    __b = std::vector<Swarm,_std::allocator<Swarm>_>::operator[](&this->instances,rhs);
    std::swap<Swarm>(__a,__b);
    sparse_set<entt::entity>::swap(&this->super_sparse_set<entt::entity>,lhs,rhs);
    return;
  }
  __assert_fail("rhs < instances.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/entt/single_include/entt/entt.hpp"
                ,0x144f,
                "virtual void entt::basic_storage<entt::entity, Swarm>::swap(const size_type, const size_type) [Entity = entt::entity, Type = Swarm]"
               );
}

Assistant:

ENTT_NOEXCEPT override {
        ENTT_ASSERT(lhs < instances.size());
        ENTT_ASSERT(rhs < instances.size());
        std::swap(instances[lhs], instances[rhs]);
        underlying_type::swap(lhs, rhs);
    }